

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# range.cpp
# Opt level: O2

void duckdb::GetParameters
               (int64_t *values,idx_t value_count,hugeint_t *start,hugeint_t *end,
               hugeint_t *increment)

{
  int64_t value;
  hugeint_t local_40;
  
  if (value_count < 2) {
    hugeint_t::hugeint_t(&local_40,0);
    start->lower = local_40.lower;
    start->upper = local_40.upper;
    hugeint_t::hugeint_t(&local_40,*values);
    end->lower = local_40.lower;
    end->upper = local_40.upper;
  }
  else {
    hugeint_t::hugeint_t(&local_40,*values);
    start->lower = local_40.lower;
    start->upper = local_40.upper;
    hugeint_t::hugeint_t(&local_40,values[1]);
    end->lower = local_40.lower;
    end->upper = local_40.upper;
    if (value_count != 2) {
      value = values[2];
      goto LAB_015a5fe9;
    }
  }
  value = 1;
LAB_015a5fe9:
  hugeint_t::hugeint_t(&local_40,value);
  increment->lower = local_40.lower;
  increment->upper = local_40.upper;
  return;
}

Assistant:

static void GetParameters(int64_t values[], idx_t value_count, hugeint_t &start, hugeint_t &end, hugeint_t &increment) {
	if (value_count < 2) {
		// single argument: only the end is specified
		start = 0;
		end = values[0];
	} else {
		// two arguments: first two arguments are start and end
		start = values[0];
		end = values[1];
	}
	if (value_count < 3) {
		increment = 1;
	} else {
		increment = values[2];
	}
}